

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O1

void __thiscall
Diffusion::diffuse_tensor_Vsync
          (Diffusion *this,MultiFab *Vsync,Real dt,Real be_cn_theta,MultiFab *rho_half,int rho_flag,
          MultiFab **param_6,int param_7,bool update_fluxreg)

{
  ostringstream *this_00;
  NavierStokesBase *pNVar1;
  void *pvVar2;
  undefined8 uVar3;
  Diffusion *pDVar4;
  uint uVar5;
  double *pdVar6;
  EBFArrayBoxFactory *pEVar7;
  MultiFab **beta;
  ostream *poVar8;
  long lVar9;
  int dir;
  int rho_comp;
  FabArray<amrex::FArrayBox> *pFVar10;
  double *pdVar11;
  double *pdVar12;
  long lVar13;
  int i;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom;
  int k;
  long lVar14;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *this_01;
  bool bVar15;
  initializer_list<amrex::Geometry> __l;
  initializer_list<amrex::BoxArray> __l_00;
  initializer_list<amrex::DistributionMapping> __l_01;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> __l_02;
  initializer_list<std::array<amrex::LinOpBCType,_3UL>_> __l_03;
  initializer_list<std::array<amrex::LinOpBCType,_3UL>_> __l_04;
  initializer_list<amrex::MultiFab_*> __l_05;
  initializer_list<const_amrex::MultiFab_*> __l_06;
  FluxBoxes fb_bcoef;
  Array<LinOpBCType,_3> mlmg_lobc [3];
  Real rhsscale;
  Array<LinOpBCType,_3> mlmg_hibc [3];
  pair<double,_double> scalars;
  MLMG mlmg;
  MultiFab Soln;
  MLEBTensorOp tensorop;
  MultiFab Rhs;
  allocator_type local_be1;
  pointer local_be0;
  int local_bd8;
  allocator_type local_bd3;
  allocator_type local_bd2;
  allocator_type local_bd1;
  vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> local_bd0;
  Real local_bb8;
  Real local_bb0;
  undefined1 local_ba8 [32];
  int local_b88;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_b78;
  ulong local_b70;
  int local_b64;
  DistributionMapping local_b60;
  vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  local_b50;
  MultiFab *local_b38;
  long local_b30;
  EBFArrayBoxFactory *local_b28;
  Real local_b20;
  undefined1 local_b18 [20];
  int local_b04;
  Long local_b00;
  int local_af8;
  Diffusion *local_ae8;
  long local_ae0;
  long local_ad8;
  long local_ad0;
  pointer local_ac8;
  long local_ac0;
  long local_ab8;
  ulong local_ab0;
  long local_aa8;
  long local_aa0;
  LPInfo local_a98;
  undefined1 local_a78 [24];
  undefined8 uStack_a60;
  int local_a58;
  undefined4 uStack_a54;
  undefined4 local_a50;
  undefined8 local_a4c;
  undefined4 local_a44;
  undefined4 local_a40;
  undefined1 local_8f0 [28];
  undefined4 uStack_8d4;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined4 local_8ac;
  IntVect local_830;
  int local_824;
  FabArray<amrex::FArrayBox> local_758;
  undefined1 local_5d8 [8];
  FabArrayBase *pFStack_5d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5c8;
  int local_5b0;
  int local_5ac;
  FabArray<amrex::FArrayBox> local_1b0;
  
  local_bd8 = rho_flag;
  local_bb8 = dt;
  local_bb0 = be_cn_theta;
  local_b78._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
       (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)rho_half;
  local_b38 = Vsync;
  if (verbose != 0) {
    pFStack_5d0 = (FabArrayBase *)amrex::OutStream();
    local_5d8._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
    local_5d8._0_4_ = *(int *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_5c8);
    *(undefined8 *)
     ((long)&local_5c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish +
     local_5c8.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
         *(undefined8 *)(pFStack_5d0->_vptr_FabArrayBase[-3] + (long)&(pFStack_5d0->boxarray).m_bat)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_5c8,"Diffusion::diffuse_tensor_Vsync ...\n",0x24);
    amrex::Print::~Print((Print *)local_5d8);
  }
  local_5d8 = (undefined1  [8])0x1;
  pFStack_5d0 = (FabArrayBase *)0x0;
  local_5c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            ((MultiFab *)&local_1b0,this->grids,this->dmap,3,0,(MFInfo *)local_5d8,
             (this->navier_stokes->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5c8);
  amrex::MultiFab::Copy((MultiFab *)&local_1b0,local_b38,0,0,3,0);
  if (1 < verbose) {
    local_be0 = (pointer)amrex::MultiFab::norm0((MultiFab *)&local_1b0,0,0,false,false);
    pFStack_5d0 = (FabArrayBase *)amrex::OutStream();
    local_5d8._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
    local_5d8._0_4_ = *(int *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_5c8);
    *(undefined8 *)
     ((long)&local_5c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish +
     local_5c8.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
         *(undefined8 *)(pFStack_5d0->_vptr_FabArrayBase[-3] + (long)&(pFStack_5d0->boxarray).m_bat)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_5c8,"Original max of Vsync ",0x16);
    std::ostream::_M_insert<double>((double)local_be0);
    local_8f0[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5c8,local_8f0,1);
    amrex::Print::~Print((Print *)local_5d8);
  }
  amrex::MFIter::MFIter((MFIter *)local_5d8,&local_1b0.super_FabArrayBase,true);
  pDVar4 = this;
  if ((int)local_5c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_5b0) {
    do {
      local_ae8 = pDVar4;
      pDVar4 = local_ae8;
      amrex::MFIter::tilebox((Box *)local_ba8,(MFIter *)local_5d8);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)local_8f0,&local_1b0,(MFIter *)local_5d8);
      if (local_bd8 == 1) {
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_a78,
                   (FabArray<amrex::FArrayBox> *)
                   local_b78._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(MFIter *)local_5d8)
        ;
      }
      else {
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&local_758,
                   (FabArray<amrex::FArrayBox> *)
                   (((pDVar4->navier_stokes->super_AmrLevel).state.
                     super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                     super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl
                     .super__Vector_impl_data._M_start)->old_data)._M_t.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                   (MFIter *)local_5d8,3);
        local_a78._0_8_ = local_758.super_FabArrayBase._vptr_FabArrayBase;
        local_a78._8_4_ = local_758.super_FabArrayBase.boxarray.m_bat.m_bat_type;
        local_a78._12_4_ = local_758.super_FabArrayBase.boxarray.m_bat.m_op._0_4_;
        local_a78._16_4_ = (undefined4)local_758.super_FabArrayBase.boxarray.m_bat.m_op._4_8_;
        local_a78._20_4_ =
             (undefined4)((ulong)local_758.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ >> 0x20);
        uStack_a60 = local_758.super_FabArrayBase.boxarray.m_bat.m_op._12_8_;
        local_a50 = local_758.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2];
        _local_a58 = local_758.super_FabArrayBase.boxarray.m_bat.m_op._20_8_;
        local_a44 = local_758.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_hishft.vect[2];
        local_a4c = local_758.super_FabArrayBase.boxarray.m_bat.m_op._32_8_;
        local_a40 = local_758.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_doilo.vect[0];
      }
      local_b64 = local_ba8._20_4_;
      local_b70 = (ulong)(uint)local_ba8._8_4_;
      if ((int)local_ba8._8_4_ <= (int)local_ba8._20_4_) {
        local_ac8 = (pointer)local_a78._0_8_;
        local_aa0 = CONCAT44(local_a78._12_4_,local_a78._8_4_);
        local_ad0 = CONCAT44(local_a78._20_4_,local_a78._16_4_);
        local_ad8 = (long)(int)local_a50;
        local_aa8 = (long)(int)uStack_a54;
        local_b30 = (long)(int)local_ba8._4_4_;
        local_ab0 = (ulong)(uint)local_ba8._16_4_;
        local_ae0 = (local_b30 - (int)local_8cc) * CONCAT44(local_8f0._12_4_,local_8f0._8_4_) * 8 +
                    (long)(int)local_ba8._0_4_ * 8 + (long)(int)local_8d0 * -8 + local_8f0._0_8_;
        local_ab8 = CONCAT44(local_8f0._20_4_,local_8f0._16_4_) * 8;
        local_ac0 = -(long)(int)local_8c8;
        do {
          if ((int)local_ba8._4_4_ <= (int)local_ba8._16_4_) {
            pdVar12 = (double *)((local_ac0 + (int)local_b70) * local_ab8 + local_ae0);
            local_be0 = (pointer)(local_a78._0_8_ + ((int)local_b70 - local_ad8) * local_ad0 * 8);
            lVar13 = local_b30;
            do {
              if ((int)local_ba8._0_4_ <= (int)local_ba8._12_4_) {
                pdVar6 = pdVar12;
                lVar9 = (long)(int)local_ba8._0_4_;
                do {
                  lVar14 = 3;
                  pdVar11 = pdVar6;
                  do {
                    *pdVar11 = (double)local_be0[(lVar13 - local_aa8) * local_aa0 +
                                                 (lVar9 - local_a58)] * *pdVar11;
                    pdVar11 = pdVar11 + stack0xfffffffffffff728;
                    lVar14 = lVar14 + -1;
                  } while (lVar14 != 0);
                  lVar9 = lVar9 + 1;
                  pdVar6 = pdVar6 + 1;
                } while (local_ba8._12_4_ + 1 != (int)lVar9);
              }
              lVar13 = lVar13 + 1;
              pdVar12 = pdVar12 + CONCAT44(local_8f0._12_4_,local_8f0._8_4_);
            } while (local_ba8._16_4_ + 1 != (int)lVar13);
          }
          uVar5 = (int)local_b70 + 1;
          bVar15 = (int)local_b70 != local_ba8._20_4_;
          local_b70 = (ulong)uVar5;
        } while (bVar15);
      }
      amrex::MFIter::operator++((MFIter *)local_5d8);
      this = local_ae8;
      pDVar4 = local_ae8;
    } while ((int)local_5c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_5b0);
  }
  amrex::MFIter::~MFIter((MFIter *)local_5d8);
  local_b20 = 1.0;
  local_5d8 = (undefined1  [8])0x1;
  pFStack_5d0 = (FabArrayBase *)0x0;
  local_5c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            ((MultiFab *)&local_758,this->grids,this->dmap,3,1,(MFInfo *)local_5d8,
             (this->navier_stokes->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5c8);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&local_758,0.0,0,local_758.super_FabArrayBase.n_comp,
             &local_758.super_FabArrayBase.n_grow);
  local_a98.do_semicoarsening = false;
  local_a98.agg_grid_size = -1;
  local_a98.con_grid_size = -1;
  local_a98.has_metric_term = true;
  local_a98.do_agglomeration = (anonymous_namespace)::agglomeration != 0;
  local_a98.max_coarsening_level = 0x1e;
  local_a98.max_semicoarsening_level = 0;
  local_a98.semicoarsening_direction = -1;
  local_a98.hidden_direction = -1;
  local_a98.do_consolidation = (anonymous_namespace)::consolidation != 0;
  local_be0 = (pointer)visc_tol;
  pNVar1 = this->navier_stokes;
  pEVar7 = (EBFArrayBoxFactory *)
           __dynamic_cast((pNVar1->super_AmrLevel).m_factory._M_t.
                          super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                          _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                          &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (pEVar7 == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  memcpy((iterator)local_8f0,&(pNVar1->super_AmrLevel).geom,200);
  __l._M_len = 1;
  __l._M_array = (iterator)local_8f0;
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
            ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)local_ba8,__l,&local_be1);
  amrex::BoxArray::BoxArray((BoxArray *)local_a78,this->grids);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_a78;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)local_b18,__l_00,
             &local_bd1);
  local_b60.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->dmap->m_ref).
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b60.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->dmap->m_ref).
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_b60.m_ref.
      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b60.m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_b60.m_ref.
            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b60.m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_b60.m_ref.
            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l_01._M_len = 1;
  __l_01._M_array = &local_b60;
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
            (&local_bd0,__l_01,&local_bd2);
  __l_02._M_len = 1;
  __l_02._M_array = &local_b28;
  local_b28 = pEVar7;
  std::vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  ::vector(&local_b50,__l_02,&local_bd3);
  a_geom = (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)local_ba8;
  amrex::MLEBTensorOp::MLEBTensorOp
            ((MLEBTensorOp *)local_5d8,a_geom,
             (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)local_b18,
             (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             &local_bd0,&local_a98,
             (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
              *)&local_b50);
  if (local_b50.
      super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b50.
                    super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b50.
                          super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b50.
                          super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
            (&local_bd0);
  if (local_b60.m_ref.
      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b60.m_ref.
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this_01 = (vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)local_b18;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(this_01);
  amrex::BoxArray::~BoxArray((BoxArray *)local_a78);
  pvVar2 = (void *)CONCAT44(local_ba8._4_4_,local_ba8._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,CONCAT44(local_ba8._20_4_,local_ba8._16_4_) - (long)pvVar2);
  }
  local_bb0 = local_bb0 * local_bb8;
  local_5ac = tensor_max_order;
  lVar13 = 0;
  do {
    setDomainBC(this,(array<amrex::LinOpBCType,_3UL> *)a_geom,
                (array<amrex::LinOpBCType,_3UL> *)this_01,(int)lVar13);
    lVar13 = lVar13 + 1;
    this_01 = (vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
              ((long)&(this_01->
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>)._M_impl
                      .super__Vector_impl_data._M_finish + 4);
    a_geom = (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
             ((long)&(a_geom->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4);
  } while (lVar13 != 3);
  local_8f0._8_4_ = local_ba8._8_4_;
  local_8f0._0_8_ = (ulong)(uint)local_ba8._4_4_ << 0x20;
  local_8f0._20_4_ = local_ba8._20_4_;
  stack0xfffffffffffff728 = local_ba8._24_8_;
  local_8d0 = local_b88;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)local_8f0;
  std::
  vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::vector((vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            *)&local_bd0,__l_03,(allocator_type *)&local_b60);
  local_a78._8_4_ = local_b18._8_4_;
  local_a78._0_8_ = local_b18._0_8_;
  local_a78._12_4_ = (undefined4)local_b18._12_8_;
  local_a78._16_4_ = SUB84(local_b18._12_8_,4);
  local_a78._20_4_ = local_b04;
  uStack_a60 = local_b00;
  local_a58 = local_af8;
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)local_a78;
  std::
  vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::vector((vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            *)&local_b50,__l_04,(allocator_type *)&local_b28);
  amrex::MLLinOp::setDomainBC
            ((MLLinOp *)local_5d8,
             (Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              *)&local_bd0,
             (Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              *)&local_b50);
  if (local_b50.
      super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b50.
                    super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b50.
                          super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b50.
                          super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_bd0.
      super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bd0.
                    super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_bd0.
                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_bd0.
                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (0 < this->level) {
    amrex::MLLinOp::setCoarseFineBC((MLLinOp *)local_5d8,(MultiFab *)0x0,(this->crse_ratio).vect[0])
    ;
  }
  rho_comp = 0;
  amrex::MLCellLinOp::setLevelBC
            ((MLCellLinOp *)local_5d8,0,(MultiFab *)0x0,(MultiFab *)0x0,(MultiFab *)0x0,
             (MultiFab *)0x0);
  amrex::MultiFab::MultiFab((MultiFab *)local_8f0);
  local_a78._0_8_ = (pointer)0x0;
  local_a78._8_4_ = 0;
  local_a78._12_4_ = 0;
  if (local_bd8 != 1) {
    local_b78._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (((this->navier_stokes->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start)->new_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
    rho_comp = 3;
  }
  computeAlpha((MultiFab *)local_8f0,(pair<double,_double> *)local_a78,1.0,local_bb0,&local_b20,
               (MultiFab *)0x0,0,local_bd8,
               (MultiFab *)
               local_b78._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,rho_comp);
  amrex::MLEBABecLap::setScalars
            ((MLEBABecLap *)local_5d8,(Real)local_a78._0_8_,
             (Real)CONCAT44(local_a78._12_4_,local_a78._8_4_));
  amrex::MLEBABecLap::setACoeffs((MLEBABecLap *)local_5d8,0,(MultiFab *)local_8f0);
  amrex::MultiFab::~MultiFab((MultiFab *)local_8f0);
  local_bd0.
  super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  beta = FluxBoxes::define((FluxBoxes *)&local_bd0,&this->navier_stokes->super_AmrLevel,1,0);
  lVar13 = 0;
  do {
    pFVar10 = &beta[lVar13]->super_FabArray<amrex::FArrayBox>;
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (pFVar10,1.0,0,(pFVar10->super_FabArrayBase).n_comp,
               &(pFVar10->super_FabArrayBase).n_grow);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  local_a78._0_8_ = (MultiFab **)0x1;
  local_a78._8_4_ = 0;
  local_a78._12_4_ = 0;
  local_a78._16_4_ = 0;
  local_a78._20_4_ = 0;
  uStack_a60 = 0;
  local_a58 = 0;
  uStack_a54 = 0;
  amrex::MultiFab::MultiFab
            ((MultiFab *)local_8f0,this->grids,this->dmap,1,0,(MFInfo *)local_a78,
             (this->navier_stokes->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_a78 + 0x10));
  pFVar10 = (FabArray<amrex::FArrayBox> *)local_8f0;
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>(pFVar10,1.0,0,local_824,&local_830)
  ;
  setViscosity((Diffusion *)pFVar10,(MLEBTensorOp *)local_5d8,beta,0,(MultiFab *)local_8f0);
  amrex::MultiFab::~MultiFab((MultiFab *)local_8f0);
  FluxBoxes::clear((FluxBoxes *)&local_bd0);
  amrex::MLMG::MLMG((MLMG *)local_8f0,(MLLinOp *)local_5d8);
  uStack_8d4 = (anonymous_namespace)::max_fmg_iter;
  local_8f0._0_4_ = verbose;
  amrex::MultiFab::mult((MultiFab *)&local_1b0,local_b20,0,1,0);
  local_8ac = 1;
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&local_b50;
  local_b50.
  super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_758;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_a78,__l_05,
             (allocator_type *)&local_b28);
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&local_b60;
  local_b60.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&local_1b0;
  std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
            ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)&local_bd0
             ,__l_06,(allocator_type *)&local_be1);
  amrex::MLMG::solve((MLMG *)local_8f0,
                     (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_a78,
                     (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                     &local_bd0,(Real)local_be0,-1.0,(char *)0x0);
  if (local_bd0.
      super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bd0.
                    super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_bd0.
                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_bd0.
                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((MultiFab **)local_a78._0_8_ != (MultiFab **)0x0) {
    operator_delete((void *)local_a78._0_8_,
                    CONCAT44(local_a78._20_4_,local_a78._16_4_) - local_a78._0_8_);
  }
  amrex::MultiFab::Copy(local_b38,(MultiFab *)&local_758,0,0,3,1);
  if (1 < verbose) {
    local_be0 = (pointer)amrex::MultiFab::norm0
                                   ((MultiFab *)&local_758,0,
                                    local_758.super_FabArrayBase.n_grow.vect[0],false,false);
    poVar8 = amrex::OutStream();
    this_00 = (ostringstream *)(local_a78 + 0x10);
    local_a78._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_a78._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    local_a78._8_4_ = SUB84(poVar8,0);
    local_a78._12_4_ = (undefined4)((ulong)poVar8 >> 0x20);
    std::__cxx11::ostringstream::ostringstream(this_00);
    *(undefined8 *)
     ((long)&uStack_a60 + *(long *)(CONCAT44(local_a78._20_4_,local_a78._16_4_) + -0x18)) =
         *(undefined8 *)
          ((long)CONCAT44(local_a78._12_4_,local_a78._8_4_) +
          *(long *)(*(long *)CONCAT44(local_a78._12_4_,local_a78._8_4_) + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Final max of Vsync ",0x13);
    std::ostream::_M_insert<double>((double)local_be0);
    local_bd0.
    super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_bd0.
                           super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)&local_bd0,1);
    amrex::Print::~Print((Print *)local_a78);
  }
  if (0 < this->level) {
    local_a78._0_8_ = (MultiFab **)0x0;
    FluxBoxes::define((FluxBoxes *)local_a78,&this->navier_stokes->super_AmrLevel,3,0);
    uVar3 = local_a78._0_8_;
    computeExtensiveFluxes
              ((MLMG *)local_8f0,(MultiFab *)&local_758,(MultiFab **)local_a78._0_8_,0,3,
               (MultiFab *)&this->navier_stokes->field_0x540,local_bb0 / local_bb8);
    if (update_fluxreg) {
      local_bb8 = local_bb8 * local_bb8;
      lVar13 = 0;
      do {
        amrex::FluxRegister::FineAdd
                  (this->viscflux_reg,*(MultiFab **)(uVar3 + lVar13 * 8),(int)lVar13,0,0,3,local_bb8
                  );
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
    }
    FluxBoxes::clear((FluxBoxes *)local_a78);
  }
  amrex::MLMG::~MLMG((MLMG *)local_8f0);
  amrex::MLEBTensorOp::~MLEBTensorOp((MLEBTensorOp *)local_5d8);
  amrex::MultiFab::~MultiFab((MultiFab *)&local_758);
  amrex::MultiFab::~MultiFab((MultiFab *)&local_1b0);
  return;
}

Assistant:

void
Diffusion::diffuse_tensor_Vsync (MultiFab&              Vsync,
                                 Real                   dt,
                                 Real                   be_cn_theta,
                                 const MultiFab&        rho_half,
                                 int                    rho_flag,
                                 const MultiFab* const* /*beta*/,
                                 int                    /*betaComp*/,
                                 bool                   update_fluxreg)
{
    BL_ASSERT(rho_flag == 1 || rho_flag == 3);

    if (verbose) amrex::Print() << "Diffusion::diffuse_tensor_Vsync ...\n";

    MultiFab Rhs(grids,dmap,AMREX_SPACEDIM,0,MFInfo(),navier_stokes->Factory());

    MultiFab::Copy(Rhs,Vsync,0,0,AMREX_SPACEDIM,0);

    if (verbose > 1)
    {
        Real r_norm = Rhs.norm0();
        amrex::Print() << "Original max of Vsync " << r_norm << '\n';
    }

    //
    // Multiply RHS by density.
    //
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Rhs, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
       const Box& bx = mfi.tilebox();
       auto const& rhs = Rhs.array(mfi);
       auto const& rho = (rho_flag == 1) ? rho_half.array(mfi) : navier_stokes->get_old_data(State_Type).array(mfi,Density);

       amrex::ParallelFor(bx, [rhs, rho]
       AMREX_GPU_DEVICE (int i, int j, int k) noexcept
       {
          for (int n = 0; n < AMREX_SPACEDIM; n++) {
             rhs(i,j,k,n) *= rho(i,j,k);
          }
       });
    }

    //
    // SET UP COEFFICIENTS FOR VISCOUS SOLVER.
    //
    const Real      a         = 1.0;
    const Real      b         = be_cn_theta*dt;
    Real rhsscale = 1.0;

    int soln_ng = 1;
    MultiFab Soln(grids,dmap,AMREX_SPACEDIM,soln_ng, MFInfo(),navier_stokes->Factory());
    Soln.setVal(0.0);

    // MLMG
    const Real tol_rel = visc_tol;
    const Real tol_abs = -1;

    LPInfo info;
    info.setAgglomeration(agglomeration);
    info.setConsolidation(consolidation);
    //info.setMaxCoarseningLevel(100);

#ifdef AMREX_USE_EB
    const auto& ebf = &dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory());
    MLEBTensorOp tensorop({navier_stokes->Geom()}, {grids}, {dmap}, info, {ebf});
#else
    MLTensorOp tensorop({navier_stokes->Geom()}, {grids}, {dmap}, info);
#endif

    tensorop.setMaxOrder(tensor_max_order);

    // create right container
    Array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc[AMREX_SPACEDIM];
    Array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc[AMREX_SPACEDIM];
    // fill it
    for (int i=0; i<AMREX_SPACEDIM; i++)
      setDomainBC(mlmg_lobc[i], mlmg_hibc[i], Xvel+i);
    // pass to op
    tensorop.setDomainBC({AMREX_D_DECL(mlmg_lobc[0],mlmg_lobc[1],mlmg_lobc[2])},
                         {AMREX_D_DECL(mlmg_hibc[0],mlmg_hibc[1],mlmg_hibc[2])});

    // set up level BCs
    if (level > 0) {
      tensorop.setCoarseFineBC(nullptr, crse_ratio[0]);
    }
    tensorop.setLevelBC(0, nullptr);

    {
      MultiFab acoef;
      std::pair<Real,Real> scalars;
      const MultiFab& rho = (rho_flag == 1) ? rho_half : navier_stokes->get_new_data(State_Type);
      const int rho_comp = (rho_flag == 1) ? 0 : Density;
      computeAlpha(acoef, scalars, a, b,
                   &rhsscale, nullptr, 0,
                   rho_flag, &rho, rho_comp);
      tensorop.setScalars(scalars.first, scalars.second);
      tensorop.setACoeffs(0, acoef);
    }

    {
      FluxBoxes  fb_bcoef;
      MultiFab** face_bcoef = 0;
      face_bcoef = fb_bcoef.define(navier_stokes);
      for (int dir=0; dir<AMREX_SPACEDIM; dir++) {
         face_bcoef[dir]->setVal(1.0);
      }

#ifdef AMREX_USE_EB
      MultiFab bcoefCC(grids,dmap,1,0,MFInfo(),navier_stokes->Factory());
      bcoefCC.setVal(1.0);
      setViscosity(tensorop, face_bcoef, 0, bcoefCC);
#else
      setViscosity(tensorop, face_bcoef, 0);
#endif
    }

    MLMG mlmg(tensorop);
    //fixme?
    //mlmg.setMaxIter(max_iter);
    //mlmg.setBottomVerbose(bottom_verbose);
    if (use_hypre) {
       mlmg.setBottomSolver(MLMG::BottomSolver::hypre);
       mlmg.setBottomVerbose(hypre_verbose);
    }
    mlmg.setMaxFmgIter(max_fmg_iter);
    mlmg.setVerbose(verbose);

    Rhs.mult(rhsscale,0,1);

    mlmg.setFinalFillBC(true);
    mlmg.solve({&Soln}, {&Rhs}, tol_rel, tol_abs);

    //
    // Copy into state variable at new time.
    //
    MultiFab::Copy(Vsync,Soln,0,0,AMREX_SPACEDIM,soln_ng);

    if (verbose > 1)
    {
        Real s_norm = Soln.norm0(0,Soln.nGrow());
        amrex::Print() << "Final max of Vsync " << s_norm << '\n';
    }

    if (level > 0)
    {
        FluxBoxes fb(navier_stokes, AMREX_SPACEDIM);
        MultiFab** tensorflux = fb.get();
        //
        // The extra factor of dt comes from the fact that Vsync looks
        // like dV/dt, not just an increment to V.
        //
        computeExtensiveFluxes(mlmg, Soln, tensorflux, 0, AMREX_SPACEDIM,
			       navier_stokes->area, b/dt);

        if (update_fluxreg)
        {
           for (int k = 0; k < AMREX_SPACEDIM; k++) {
              viscflux_reg->FineAdd(*(tensorflux[k]),k,Xvel,Xvel,AMREX_SPACEDIM,dt*dt);
           }
        }
    }
}